

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMapDetails::Path::
replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
          (Path *this,BranchNode<unsigned_long,_8U,_true> *node,uint32_t size,IndexPair offset)

{
  reference pEVar1;
  iterator pEVar2;
  NodeRef *pNVar3;
  uint32_t in_ECX;
  uint32_t in_EDX;
  BranchNode<unsigned_long,_8U,_true> *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t level;
  NodeRef in_stack_ffffffffffffffc0;
  Entry local_30 [3];
  
  level = (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  Entry::Entry<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
            (local_30,in_RSI,in_EDX,in_ECX);
  pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::front(in_RDI);
  pEVar1->node = local_30[0].node;
  pEVar1->size = local_30[0].size;
  pEVar1->offset = local_30[0].offset;
  pEVar2 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::begin(in_RDI);
  pEVar2 = pEVar2 + 1;
  pNVar3 = childAt((Path *)in_stack_ffffffffffffffc0.pip.value,level);
  Entry::Entry((Entry *)(pNVar3->pip).value,in_stack_ffffffffffffffc0,
               (uint32_t)((ulong)in_RDI >> 0x20));
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::insert(in_RDI,pEVar2,(Entry *)0x7063f1);
  return;
}

Assistant:

void replaceRoot(TNode* node, uint32_t size, IndexPair offset) {
        SLANG_ASSERT(!path.empty());
        path.front() = Entry(node, size, offset.first);
        path.insert(path.begin() + 1, Entry(childAt(0), offset.second));
    }